

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O3

Error __thiscall
asmjit::X86RAPass::emitImmToStack(X86RAPass *this,uint32_t dstTypeId,X86Mem *dst,Imm *src)

{
  undefined8 uVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  Error EVar3;
  CodeBuilder *this_00;
  Imm imm;
  X86Mem mem;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  anon_union_16_7_ed616b9d_for_Operand__0 local_28;
  
  uVar1 = *(undefined8 *)&(dst->super_Mem).super_Operand.super_Operand_.field_0;
  local_28._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)
       ((anon_union_8_2_78723da6_for_MemData_2 *)
       ((long)&(dst->super_Mem).super_Operand.super_Operand_.field_0 + 8))->field_1;
  local_38._packed[0].field_10 = (src->super_Operand).super_Operand_.field_0._packed[0];
  local_38._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)
       ((anon_union_8_2_78723da6_for_MemData_2 *)
       ((long)&(src->super_Operand).super_Operand_.field_0 + 8))->offset64;
  EVar3 = 4;
  if (dstTypeId - 0x22 < 0x11) {
    this_00 = (this->super_RAPass).super_CBPass._cb;
    local_28._any.signature._0_3_ = (undefined3)uVar1;
    local_28._any.id = (uint32_t)((ulong)uVar1 >> 0x20);
    switch(dstTypeId) {
    case 0x22:
    case 0x23:
      local_38._mem.field_2 =
           (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_38._mem.field_2 & 0xff);
    case 0x24:
    case 0x25:
      local_38._mem.field_2 =
           (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_38._mem.field_2 & 0xffff);
    case 0x26:
    case 0x27:
    case 0x2a:
      local_28._any.signature._3_1_ = 4;
      local_38._mem.field_2 =
           (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_38._mem.field_2 & 0xffffffff);
      break;
    default:
      if ((this_00->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._gpSize == '\x04') {
        aVar2.offset64 = (ulong)local_38._mem.field_2 >> 0x20;
        local_28._any.signature._3_1_ = 4;
        local_38._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_38._mem.field_2 & 0xffffffff);
        CodeEmitter::emit(&this_00->super_CodeEmitter,0x189,(Operand_ *)&local_28._any,
                          (Operand_ *)&local_38._any);
        local_28._any.reserved8_4 = local_28._any.reserved8_4 + 4;
        this_00 = (this->super_RAPass).super_CBPass._cb;
        local_38._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)aVar2.offset64;
      }
      else {
        local_28._any.signature._3_1_ = 8;
      }
      break;
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
      goto switchD_0012471d_caseD_2c;
    }
    EVar3 = 0;
    CodeEmitter::emit(&this_00->super_CodeEmitter,0x189,(Operand_ *)&local_28._any,
                      (Operand_ *)&local_38._any);
  }
switchD_0012471d_caseD_2c:
  return EVar3;
}

Assistant:

Error X86RAPass::emitImmToStack(uint32_t dstTypeId, const X86Mem* dst, const Imm* src) noexcept {
  X86Mem mem(*dst);
  Imm imm(*src);

  // One stack entry has the same size as the native register size. That means
  // that if we want to move a 32-bit integer on the stack in 64-bit mode, we
  // need to extend it to a 64-bit integer first. In 32-bit mode, pushing a
  // 64-bit on stack is done in two steps by pushing low and high parts
  // separately.
  uint32_t gpSize = cc()->getGpSize();

  switch (dstTypeId) {
    case TypeId::kI8:
    case TypeId::kU8:
      imm.truncateTo8Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI16:
    case TypeId::kU16:
      imm.truncateTo16Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kF32:
      mem.setSize(4);
      imm.truncateTo32Bits();
      cc()->emit(X86Inst::kIdMov, mem, imm);
      break;

    case TypeId::kI64:
    case TypeId::kU64:
    case TypeId::kF64:
    case TypeId::kMmx32:
    case TypeId::kMmx64:
      if (gpSize == 4) {
        uint32_t hi = imm.getUInt32Hi();

        // Lo-Part.
        mem.setSize(4);
        imm.truncateTo32Bits();

        cc()->emit(X86Inst::kIdMov, mem, imm);
        mem.addOffsetLo32(gpSize);

        // Hi-Part.
        imm.setUInt32(hi);
        cc()->emit(X86Inst::kIdMov, mem, imm);
      }
      else {
        mem.setSize(8);
        cc()->emit(X86Inst::kIdMov, mem, imm);
      }
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  return kErrorOk;
}